

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O1

ssize_t __thiscall
zmq::mailbox_safe_t::send(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  atomic_ptr_t<zmq::command_t> *paVar1;
  pointer ppsVar2;
  int iVar3;
  command_t *pcVar4;
  undefined4 extraout_var;
  ssize_t sVar5;
  int __flags_00;
  command_t *pcVar6;
  size_t __n_00;
  void *extraout_RDX;
  void *pvVar8;
  void *extraout_RDX_00;
  size_t __n_01;
  undefined4 in_register_00000034;
  void *__buf_00;
  pointer ppsVar9;
  bool bVar10;
  command_t *pcVar7;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar8 = __buf_00;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this->_sync);
  if (iVar3 != 0) {
    send(iVar3,pvVar8,__n_00,(int)__n);
  }
  ypipe_t<zmq::command_t,_16>::write(&this->_cpipe,__fd,(void *)0x0,__n);
  pcVar7 = (this->_cpipe)._w;
  pcVar6 = (this->_cpipe)._f;
  if (pcVar7 != pcVar6) {
    paVar1 = &(this->_cpipe)._c;
    LOCK();
    pcVar4 = (paVar1->_ptr)._M_b._M_p;
    bVar10 = pcVar7 == pcVar4;
    if (bVar10) {
      (paVar1->_ptr)._M_b._M_p = pcVar6;
      pcVar4 = pcVar7;
    }
    UNLOCK();
    if (bVar10) {
      pcVar4 = pcVar7;
    }
    pcVar7 = (this->_cpipe)._f;
    if (pcVar4 == (this->_cpipe)._w) {
      (this->_cpipe)._w = pcVar7;
    }
    else {
      LOCK();
      paVar1 = &(this->_cpipe)._c;
      pcVar6 = (paVar1->_ptr)._M_b._M_p;
      (paVar1->_ptr)._M_b._M_p = pcVar7;
      UNLOCK();
      (this->_cpipe)._w = (this->_cpipe)._f;
      std::_V2::condition_variable_any::notify_all(&(this->_cond_var)._cv);
      ppsVar2 = (this->_signalers).
                super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar8 = extraout_RDX;
      for (ppsVar9 = (this->_signalers).
                     super__Vector_base<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; pcVar7 = pcVar6, ppsVar9 != ppsVar2;
          ppsVar9 = ppsVar9 + 1) {
        signaler_t::send(*ppsVar9,(int)__buf_00,pvVar8,(size_t)pcVar6,__flags);
        pvVar8 = extraout_RDX_00;
      }
    }
  }
  __flags_00 = (int)pcVar7;
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)this->_sync);
  sVar5 = CONCAT44(extraout_var,iVar3);
  if (iVar3 != 0) {
    sVar5 = send(iVar3,__buf_00,__n_01,__flags_00);
  }
  return sVar5;
}

Assistant:

void zmq::mailbox_safe_t::send (const command_t &cmd_)
{
    _sync->lock ();
    _cpipe.write (cmd_, false);
    const bool ok = _cpipe.flush ();

    if (!ok) {
        _cond_var.broadcast ();

        for (std::vector<signaler_t *>::iterator it = _signalers.begin (),
                                                 end = _signalers.end ();
             it != end; ++it) {
            (*it)->send ();
        }
    }

    _sync->unlock ();
}